

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O1

StructValues<wasm::(anonymous_namespace)::FieldInfo> * __thiscall
wasm::StructUtils::StructValuesMap<wasm::(anonymous_namespace)::FieldInfo>::operator[]
          (StructValuesMap<wasm::(anonymous_namespace)::FieldInfo> *this,HeapType type)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __node_base_ptr p_Var3;
  _Hash_node_base *p_Var4;
  __buckets_ptr pp_Var5;
  FieldInfo *pFVar6;
  FieldInfo *pFVar7;
  __node_base_ptr p_Var8;
  HeapTypeKind HVar9;
  pointer pFVar10;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
  *this_00;
  _Hash_node_base *p_Var11;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var12;
  Struct *pSVar13;
  pointer pFVar14;
  _Hash_node_base *p_Var15;
  ulong uVar16;
  ulong uVar17;
  size_type __n;
  FieldInfo *pFVar18;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
  *p_Var19;
  _Hash_node_base _Var20;
  __node_ptr __n_00;
  __node_base_ptr p_Var21;
  HeapType HVar22;
  ulong uVar23;
  long lVar24;
  void *__s_00;
  _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
  *this_01;
  undefined1 auVar25 [16];
  _Hash_node_base local_48;
  HeapType type_local;
  new_allocator<std::__detail::_Hash_node_base_*> local_31 [8];
  __buckets_alloc_type __alloc;
  
  local_48._M_nxt = (_Hash_node_base *)type.id;
  HVar9 = HeapType::getKind((HeapType *)&local_48);
  _Var20._M_nxt = local_48._M_nxt;
  if (HVar9 != Struct) {
    __assert_fail("type.isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                  ,0x3a,
                  "StructValues<T> &wasm::StructUtils::StructValuesMap<wasm::(anonymous namespace)::FieldInfo>::operator[](HeapType) [T = wasm::(anonymous namespace)::FieldInfo]"
                 );
  }
  pFVar10 = std::
            _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
            ::_M_allocate((_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                           *)0x0,type.id);
  this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
             *)operator_new(0x30);
  *(_Hash_node_base **)&this_00->field_0x0 = (_Hash_node_base *)0x0;
  *(_Hash_node_base **)&this_00[8].field_0x0 = _Var20._M_nxt;
  *(pointer *)&this_00[0x10].field_0x0 = pFVar10;
  *(pointer *)&this_00[0x18].field_0x0 = pFVar10;
  *(pointer *)&this_00[0x20].field_0x0 = pFVar10;
  p_Var11 = (_Hash_node_base *)
            std::hash<wasm::HeapType>::operator()
                      ((hash<wasm::HeapType> *)this,(HeapType *)(this_00 + 8));
  __n_00 = (__node_ptr)
           (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           )._M_h._M_bucket_count;
  p_Var21 = (__node_base_ptr)0x0;
  uVar17 = (ulong)p_Var11 % (ulong)__n_00;
  p_Var3 = (this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           )._M_h._M_buckets[uVar17];
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var15 = p_Var3->_M_nxt[5]._M_nxt;
    p_Var8 = p_Var3->_M_nxt;
    do {
      p_Var21 = p_Var3;
      if ((p_Var15 == p_Var11) && (*(_Hash_node_base **)&this_00[8].field_0x0 == p_Var8[1]._M_nxt))
      break;
      p_Var4 = p_Var8->_M_nxt;
      if (p_Var4 == (_Hash_node_base *)0x0) {
        p_Var21 = (__node_base_ptr)0x0;
        break;
      }
      p_Var15 = p_Var4[5]._M_nxt;
      p_Var21 = (__node_base_ptr)0x0;
      p_Var3 = p_Var8;
      p_Var8 = p_Var4;
    } while ((ulong)p_Var15 % (ulong)__n_00 == uVar17);
  }
  if (p_Var21 == (__node_base_ptr)0x0) {
    p_Var19 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
               *)0x0;
  }
  else {
    p_Var19 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
               *)p_Var21->_M_nxt;
  }
  HVar22.id = (uintptr_t)p_Var19;
  if (p_Var19 ==
      (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
       *)0x0) {
    type_local.id = (uintptr_t)p_Var19;
    auVar25 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                        ((ulong)&(this->
                                 super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                                 )._M_h._M_rehash_policy,(ulong)__n_00,
                         (this->
                         super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                         )._M_h._M_element_count);
    __n = auVar25._8_8_;
    if ((auVar25 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      if (__n == 1) {
        __s = &(this->
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               )._M_h._M_single_bucket;
        (this->
        super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
        )._M_h._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        (local_31,__n,(void *)0x0);
        memset(__s,0,__n * 8);
      }
      __n_00 = (__node_ptr)
               (this->
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
               )._M_h._M_before_begin._M_nxt;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if (__n_00 != (__node_ptr)0x0) {
        p_Var1 = &(this->
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  )._M_h._M_before_begin;
        _Var20._M_nxt = (_Hash_node_base *)__n_00;
        uVar17 = 0;
        do {
          __n_00 = (__node_ptr)(_Var20._M_nxt)->_M_nxt;
          uVar16 = (ulong)_Var20._M_nxt[5]._M_nxt % __n;
          if (__s[uVar16] == (_Hash_node_base *)0x0) {
            (_Var20._M_nxt)->_M_nxt = p_Var1->_M_nxt;
            p_Var1->_M_nxt = _Var20._M_nxt;
            __s[uVar16] = p_Var1;
            if ((_Var20._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
              pp_Var12 = __s + uVar17;
              goto LAB_00897b5f;
            }
          }
          else {
            (_Var20._M_nxt)->_M_nxt = __s[uVar16]->_M_nxt;
            pp_Var12 = &__s[uVar16]->_M_nxt;
            uVar16 = uVar17;
LAB_00897b5f:
            *pp_Var12 = _Var20._M_nxt;
          }
          _Var20._M_nxt = (_Hash_node_base *)__n_00;
          uVar17 = uVar16;
        } while (__n_00 != (__node_ptr)0x0);
      }
      pp_Var5 = (this->
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                )._M_h._M_buckets;
      if (&(this->
           super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
           )._M_h._M_single_bucket != pp_Var5) {
        __n_00 = (__node_ptr)
                 ((this->
                  super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                  )._M_h._M_bucket_count << 3);
        operator_delete(pp_Var5,(ulong)__n_00);
      }
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      )._M_h._M_bucket_count = __n;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      )._M_h._M_buckets = __s;
      uVar17 = (ulong)p_Var11 % __n;
    }
    *(_Hash_node_base **)&this_00[0x28].field_0x0 = p_Var11;
    pp_Var5 = (this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              )._M_h._M_buckets;
    if (pp_Var5[uVar17] == (__node_base_ptr)0x0) {
      __n_00 = (__node_ptr)
               &(this->
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                )._M_h._M_before_begin;
      p_Var11 = (this->
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                )._M_h._M_before_begin._M_nxt;
      *(_Hash_node_base **)&this_00->field_0x0 = p_Var11;
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      )._M_h._M_before_begin._M_nxt = (_Hash_node_base *)this_00;
      if (p_Var11 != (_Hash_node_base *)0x0) {
        pp_Var5[(ulong)p_Var11[5]._M_nxt %
                (this->
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
                )._M_h._M_bucket_count] = (__node_base_ptr)this_00;
      }
      (this->
      super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
      )._M_h._M_buckets[uVar17] = (__node_base_ptr)__n_00;
    }
    else {
      *(_Hash_node_base **)&this_00->field_0x0 = pp_Var5[uVar17]->_M_nxt;
      pp_Var5[uVar17]->_M_nxt = (_Hash_node_base *)this_00;
    }
    psVar2 = &(this->
              super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>_>_>
              )._M_h._M_element_count;
    *psVar2 = *psVar2 + 1;
    p_Var19 = this_00;
    this_00 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
               *)0x0;
    HVar22.id = type_local.id;
  }
  if (this_00 !=
      (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
       *)0x0) {
    std::__detail::
    _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
    ::_M_deallocate_node(this_00,__n_00);
  }
  if ((_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
       *)HVar22.id ==
      (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::(anonymous_namespace)::FieldInfo>_>,_true>_>_>
       *)0x0) {
    pSVar13 = HeapType::getStruct((HeapType *)&local_48);
    uVar16 = (long)(pSVar13->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(pSVar13->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 4;
    p_Var11 = *(_Hash_node_base **)&p_Var19[0x18].field_0x0;
    lVar24 = (long)p_Var11 - (long)*(_Hash_node_base **)&p_Var19[0x10].field_0x0;
    uVar17 = lVar24 >> 1;
    uVar23 = uVar16 - uVar17;
    if (uVar16 < uVar17 || uVar23 == 0) {
      if ((uVar16 >= uVar17) ||
         (p_Var15 = (_Hash_node_base *)
                    ((long)&(*(_Hash_node_base **)&p_Var19[0x10].field_0x0)->_M_nxt + uVar16 * 2),
         p_Var11 == p_Var15)) goto LAB_00897bfd;
    }
    else {
      if ((ulong)((long)*(_Hash_node_base **)&p_Var19[0x20].field_0x0 - (long)p_Var11 >> 1) < uVar23
         ) {
        if ((uVar17 ^ 0x3fffffffffffffff) < uVar23) {
          std::__throw_length_error("vector::_M_default_append");
        }
        uVar16 = uVar23;
        if (uVar23 < uVar17) {
          uVar16 = uVar17;
        }
        this_01 = (_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                   *)(uVar16 + uVar17);
        if ((_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
             *)0x3ffffffffffffffe < this_01) {
          this_01 = (_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     *)0x3fffffffffffffff;
        }
        if (CARRY8(uVar16,uVar17)) {
          this_01 = (_Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                     *)0x3fffffffffffffff;
        }
        pFVar14 = std::
                  _Vector_base<wasm::(anonymous_namespace)::FieldInfo,_std::allocator<wasm::(anonymous_namespace)::FieldInfo>_>
                  ::_M_allocate(this_01,(size_t)__n_00);
        __s_00 = (void *)(lVar24 + (long)pFVar14);
        memset(__s_00,0,uVar23 * 2);
        pFVar7 = *(FieldInfo **)&p_Var19[0x18].field_0x0;
        pFVar6 = *(FieldInfo **)&p_Var19[0x10].field_0x0;
        pFVar10 = pFVar14;
        for (pFVar18 = pFVar6; pFVar18 != pFVar7; pFVar18 = pFVar18 + 1) {
          *pFVar10 = *pFVar18;
          pFVar10 = pFVar10 + 1;
        }
        if (pFVar6 != (FieldInfo *)0x0) {
          operator_delete(pFVar6,(long)*(_Hash_node_base **)&p_Var19[0x20].field_0x0 - (long)pFVar6)
          ;
        }
        *(pointer *)&p_Var19[0x10].field_0x0 = pFVar14;
        *(_Hash_node_base **)&p_Var19[0x18].field_0x0 =
             (_Hash_node_base *)((long)__s_00 + uVar23 * 2);
        *(pointer *)&p_Var19[0x20].field_0x0 = pFVar14 + (long)this_01;
        goto LAB_00897bfd;
      }
      memset(p_Var11,0,uVar23 * 2);
      p_Var15 = (_Hash_node_base *)((long)p_Var11 + uVar23 * 2);
    }
    *(_Hash_node_base **)&p_Var19[0x18].field_0x0 = p_Var15;
  }
LAB_00897bfd:
  return (StructValues<wasm::(anonymous_namespace)::FieldInfo> *)(p_Var19 + 0x10);
}

Assistant:

StructValues<T>& operator[](HeapType type) {
    assert(type.isStruct());
    auto inserted = this->insert({type, {}});
    auto& values = inserted.first->second;
    if (inserted.second) {
      values.resize(type.getStruct().fields.size());
    }
    return values;
  }